

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

void __thiscall CMU462::StaticScene::Mesh::Mesh(Mesh *this,HalfedgeMesh *mesh,BSDF *bsdf)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  undefined8 *puVar1;
  unsigned_long *puVar2;
  long lVar3;
  _List_node_base *p_Var4;
  iterator iVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  mapped_type *pmVar8;
  Vector3D *pVVar9;
  int i;
  ulong uVar10;
  ulong uVar11;
  _Self __tmp;
  long lVar12;
  _List_node_base *p_Var13;
  vector<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_> verts;
  Vertex *v;
  HalfedgeMesh _mesh;
  unordered_map<const_CMU462::Vertex_*,_int,_std::hash<const_CMU462::Vertex_*>,_std::equal_to<const_CMU462::Vertex_*>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>_>
  vertexLabels;
  void *local_128;
  iterator iStack_120;
  Vertex **local_118;
  key_type local_108;
  Vector3D local_100;
  BSDF *local_e8;
  HalfedgeMesh local_e0;
  _Hashtable<const_CMU462::Vertex_*,_std::pair<const_CMU462::Vertex_*const,_int>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CMU462::Vertex_*>,_std::hash<const_CMU462::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  (this->super_SceneObject)._vptr_SceneObject = (_func_int **)&PTR_get_primitives_0026ba98;
  this_00 = &this->indices;
  (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  HalfedgeMesh::HalfedgeMesh(&local_e0,mesh);
  HalfedgeMesh::triangulate(&local_e0);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_128 = (void *)0x0;
  iStack_120._M_current = (Vertex **)0x0;
  local_118 = (Vertex **)0x0;
  uVar11 = 0;
  local_e8 = bsdf;
  if (local_e0.vertices.super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl.
      _M_node.super__List_node_base._M_next != (_List_node_base *)&local_e0.vertices) {
    p_Var13 = local_e0.vertices.super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
              _M_impl._M_node.super__List_node_base._M_next;
    do {
      local_100.x = (double)(p_Var13 + 1);
      if (iStack_120._M_current == local_118) {
        std::vector<CMU462::Vertex_const*,std::allocator<CMU462::Vertex_const*>>::
        _M_realloc_insert<CMU462::Vertex_const*const&>
                  ((vector<CMU462::Vertex_const*,std::allocator<CMU462::Vertex_const*>> *)&local_128
                   ,iStack_120,(Vertex **)&local_100);
      }
      else {
        *iStack_120._M_current = (Vertex *)local_100.x;
        iStack_120._M_current = iStack_120._M_current + 1;
      }
      pmVar8 = std::__detail::
               _Map_base<const_CMU462::Vertex_*,_std::pair<const_CMU462::Vertex_*const,_int>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CMU462::Vertex_*>,_std::hash<const_CMU462::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_CMU462::Vertex_*,_std::pair<const_CMU462::Vertex_*const,_int>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CMU462::Vertex_*>,_std::hash<const_CMU462::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_68,(key_type *)&local_100);
      *pmVar8 = (mapped_type)uVar11;
      uVar11 = uVar11 + 1;
      p_Var13 = p_Var13->_M_next;
    } while (p_Var13 != (_List_node_base *)&local_e0.vertices);
  }
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar11;
  uVar10 = 0xffffffffffffffff;
  if (SUB168(auVar6 * ZEXT816(0x18),8) == 0) {
    uVar10 = SUB168(auVar6 * ZEXT816(0x18),0);
  }
  pVVar9 = (Vector3D *)operator_new__(uVar10);
  if (uVar11 != 0) {
    memset(pVVar9,0,((uVar11 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
  }
  this->positions = pVVar9;
  pVVar9 = (Vector3D *)operator_new__(uVar10);
  if (uVar11 == 0) {
    this->normals = pVVar9;
  }
  else {
    lVar12 = 0;
    memset(pVVar9,0,((uVar11 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
    this->normals = pVVar9;
    uVar10 = 0;
    do {
      lVar3 = *(long *)((long)local_128 + uVar10 * 8);
      pVVar9 = this->positions;
      *(undefined8 *)((long)&pVVar9->z + lVar12) = *(undefined8 *)(lVar3 + 0x18);
      uVar7 = *(undefined8 *)(lVar3 + 0x10);
      puVar1 = (undefined8 *)((long)&pVVar9->x + lVar12);
      *puVar1 = *(undefined8 *)(lVar3 + 8);
      puVar1[1] = uVar7;
      Vertex::normal(&local_100,*(Vertex **)((long)local_128 + uVar10 * 8));
      pVVar9 = this->normals;
      *(double *)((long)&pVVar9->z + lVar12) = local_100.z;
      puVar2 = (unsigned_long *)((long)&pVVar9->x + lVar12);
      *puVar2 = (unsigned_long)local_100.x;
      puVar2[1] = (unsigned_long)local_100.y;
      uVar10 = uVar10 + 1;
      lVar12 = lVar12 + 0x18;
    } while (uVar11 != uVar10);
  }
  if (local_e0.faces.super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl._M_node.
      super__List_node_base._M_next != (_List_node_base *)&local_e0.faces) {
    p_Var13 = local_e0.faces.super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl.
              _M_node.super__List_node_base._M_next;
    do {
      p_Var4 = p_Var13[0xb]._M_prev;
      local_108 = (key_type)(p_Var4[2]._M_prev + 1);
      pmVar8 = std::__detail::
               _Map_base<const_CMU462::Vertex_*,_std::pair<const_CMU462::Vertex_*const,_int>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CMU462::Vertex_*>,_std::hash<const_CMU462::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_CMU462::Vertex_*,_std::pair<const_CMU462::Vertex_*const,_int>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CMU462::Vertex_*>,_std::hash<const_CMU462::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_68,&local_108);
      local_100.x = (double)(long)*pmVar8;
      iVar5._M_current =
           (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (this_00,iVar5,(unsigned_long *)&local_100);
      }
      else {
        *iVar5._M_current = (unsigned_long)local_100.x;
        (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      local_108 = (key_type)(p_Var4[2]._M_next[2]._M_prev + 1);
      pmVar8 = std::__detail::
               _Map_base<const_CMU462::Vertex_*,_std::pair<const_CMU462::Vertex_*const,_int>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CMU462::Vertex_*>,_std::hash<const_CMU462::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_CMU462::Vertex_*,_std::pair<const_CMU462::Vertex_*const,_int>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CMU462::Vertex_*>,_std::hash<const_CMU462::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_68,&local_108);
      local_100.x = (double)(long)*pmVar8;
      iVar5._M_current =
           (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (this_00,iVar5,(unsigned_long *)&local_100);
      }
      else {
        *iVar5._M_current = (unsigned_long)local_100.x;
        (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      local_108 = (key_type)(p_Var4[2]._M_next[2]._M_next[2]._M_prev + 1);
      pmVar8 = std::__detail::
               _Map_base<const_CMU462::Vertex_*,_std::pair<const_CMU462::Vertex_*const,_int>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CMU462::Vertex_*>,_std::hash<const_CMU462::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_CMU462::Vertex_*,_std::pair<const_CMU462::Vertex_*const,_int>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CMU462::Vertex_*>,_std::hash<const_CMU462::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_68,&local_108);
      local_100.x = (double)(long)*pmVar8;
      iVar5._M_current =
           (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (this_00,iVar5,(unsigned_long *)&local_100);
      }
      else {
        *iVar5._M_current = (unsigned_long)local_100.x;
        (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      p_Var13 = p_Var13->_M_next;
    } while (p_Var13 != (_List_node_base *)&local_e0.faces);
  }
  this->bsdf = local_e8;
  if (local_128 != (void *)0x0) {
    operator_delete(local_128,(long)local_118 - (long)local_128);
  }
  std::
  _Hashtable<const_CMU462::Vertex_*,_std::pair<const_CMU462::Vertex_*const,_int>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CMU462::Vertex_*>,_std::hash<const_CMU462::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  std::__cxx11::_List_base<CMU462::Face,_std::allocator<CMU462::Face>_>::_M_clear
            (&local_e0.boundaries.super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>);
  std::__cxx11::_List_base<CMU462::Face,_std::allocator<CMU462::Face>_>::_M_clear
            (&local_e0.faces.super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>);
  std::__cxx11::_List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>::_M_clear
            (&local_e0.edges.super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>);
  std::__cxx11::_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::_M_clear
            (&local_e0.vertices.super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>);
  std::__cxx11::_List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>::_M_clear
            ((_List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_> *)&local_e0);
  return;
}

Assistant:

Mesh::Mesh(const HalfedgeMesh& mesh, BSDF* bsdf) {

  // triangulate mesh before sending to visualization or render mode
  HalfedgeMesh _mesh(mesh);
  _mesh.triangulate();

  unordered_map<const Vertex *, int> vertexLabels;
  vector<const Vertex *> verts;

  size_t vertexI = 0;
  for (VertexCIter it = _mesh.verticesBegin(); it != _mesh.verticesEnd(); it++) {
    const Vertex *v = &*it;
    verts.push_back(v);
    vertexLabels[v] = vertexI;
    vertexI++;
  }

  positions = new Vector3D[vertexI];
  normals   = new Vector3D[vertexI];
  for (int i = 0; i < vertexI; i++) {
    positions[i] = verts[i]->position;
    normals[i]   = verts[i]->normal();
  }

  for (FaceCIter f = _mesh.facesBegin(); f != _mesh.facesEnd(); f++) {
    HalfedgeCIter h = f->halfedge();
    indices.push_back(vertexLabels[&*h->vertex()]);
    indices.push_back(vertexLabels[&*h->next()->vertex()]);
    indices.push_back(vertexLabels[&*h->next()->next()->vertex()]);
  }

  this->bsdf = bsdf;

}